

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void cf_sha512_digest(cf_sha512_context *ctx,uint8_t *hash)

{
  cf_sha512_context ours;
  cf_sha512_context local_e0;
  
  memcpy(&local_e0,ctx,0xd0);
  cf_sha512_digest_final(&local_e0,hash);
  return;
}

Assistant:

void cf_sha512_digest(const cf_sha512_context *ctx, uint8_t hash[CF_SHA512_HASHSZ])
{
  /* We copy the context, so the finalisation doesn't effect the caller's
   * context.  This means the caller can do:
   *
   * x = init()
   * x.update('hello')
   * h1 = x.digest()
   * x.update(' world')
   * h2 = x.digest()
   *
   * to get h1 = H('hello') and h2 = H('hello world')
   *
   * This wouldn't work if we applied MD-padding to *ctx.
   */

  cf_sha512_context ours = *ctx;
  cf_sha512_digest_final(&ours, hash);
}